

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O2

int faidx_has_seq(faidx_t *fai,char *seq)

{
  kh_s_t *h;
  khint_t kVar1;
  
  h = fai->hash;
  kVar1 = kh_get_s(h,seq);
  return (int)(kVar1 != h->n_buckets);
}

Assistant:

int faidx_has_seq(const faidx_t *fai, const char *seq)
{
    khiter_t iter = kh_get(s, fai->hash, seq);
    if (iter == kh_end(fai->hash)) return 0;
    return 1;
}